

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O3

void glfwGetWindowFrameSize(GLFWwindow *handle,int *left,int *top,int *right,int *bottom)

{
  undefined8 uVar1;
  Atom AVar2;
  int iVar3;
  unsigned_long uVar4;
  _GLFWwindow *window;
  double dVar5;
  double dVar6;
  int *piStack_1d0;
  int *piStack_1c8;
  int *piStack_1c0;
  int *piStack_1b8;
  timeval atStack_1b0 [2];
  undefined8 uStack_190;
  Atom AStack_188;
  undefined4 uStack_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  int iStack_154;
  undefined1 auStack_f0 [192];
  
  if (left != (int *)0x0) {
    *left = 0;
  }
  if (top != (int *)0x0) {
    *top = 0;
  }
  if (right != (int *)0x0) {
    *right = 0;
  }
  if (bottom != (int *)0x0) {
    *bottom = 0;
  }
  if (_glfwInitialized == '\0') {
    _glfwInputError(0x10001,(char *)0x0);
    return;
  }
  piStack_1d0 = (int *)0x0;
  if (_glfw.x11.NET_FRAME_EXTENTS == 0) {
    return;
  }
  piStack_1c0 = top;
  piStack_1b8 = right;
  XGetWindowAttributes(_glfw.x11.display,*(undefined8 *)(handle + 0x288),atStack_1b0);
  AVar2 = _glfw.x11.NET_REQUEST_FRAME_EXTENTS;
  if (_glfw.x11.NET_REQUEST_FRAME_EXTENTS != 0 && iStack_154 != 2) {
    uVar1 = *(undefined8 *)(handle + 0x288);
    piStack_1c8 = bottom;
    memset(atStack_1b0,0,0xc0);
    atStack_1b0[0].tv_sec = CONCAT44(atStack_1b0[0].tv_sec._4_4_,0x21);
    uStack_180 = 0x20;
    AStack_188 = AVar2;
    uStack_178 = 0;
    uStack_170 = 0;
    uStack_168 = 0;
    uStack_160 = 0;
    uStack_190 = uVar1;
    XSendEvent(_glfw.x11.display,_glfw.x11.root,0,0x180000,atStack_1b0);
    dVar5 = _glfwPlatformGetTime();
    iVar3 = XCheckIfEvent(_glfw.x11.display,auStack_f0,isFrameExtentsEvent,handle);
    bottom = piStack_1c8;
    if (iVar3 == 0) {
      do {
        dVar6 = _glfwPlatformGetTime();
        dVar6 = (dVar5 + 0.5) - dVar6;
        if (dVar6 <= 0.0) {
          _glfwInputError(0x10008,
                          "X11: The window manager has a broken _NET_REQUEST_FRAME_EXTENTS implementation; please report this issue"
                         );
          return;
        }
        atStack_1b0[0].tv_sec = 0;
        atStack_1b0[0].tv_usec = (__suseconds_t)(dVar6 * 1000000.0);
        selectDisplayConnection(atStack_1b0);
        iVar3 = XCheckIfEvent(_glfw.x11.display,auStack_f0,isFrameExtentsEvent,handle);
        bottom = piStack_1c8;
      } while (iVar3 == 0);
    }
  }
  uVar4 = _glfwGetWindowProperty
                    (*(Window *)(handle + 0x288),_glfw.x11.NET_FRAME_EXTENTS,6,
                     (uchar **)&piStack_1d0);
  if (uVar4 == 4) {
    if (left != (int *)0x0) {
      *left = *piStack_1d0;
    }
    if (piStack_1c0 != (int *)0x0) {
      *piStack_1c0 = piStack_1d0[4];
    }
    if (piStack_1b8 != (int *)0x0) {
      *piStack_1b8 = piStack_1d0[2];
    }
    if (bottom != (int *)0x0) {
      *bottom = piStack_1d0[6];
      goto LAB_0010af72;
    }
  }
  if (piStack_1d0 == (int *)0x0) {
    return;
  }
LAB_0010af72:
  XFree();
  return;
}

Assistant:

GLFWAPI void glfwGetWindowFrameSize(GLFWwindow* handle,
                                    int* left, int* top,
                                    int* right, int* bottom)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;

    if (left)
        *left = 0;
    if (top)
        *top = 0;
    if (right)
        *right = 0;
    if (bottom)
        *bottom = 0;

    _GLFW_REQUIRE_INIT();
    _glfwPlatformGetWindowFrameSize(window, left, top, right, bottom);
}